

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

PAL_ERROR MAPGrowLocalFile(INT UnixFD,UINT NewSize)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  __off64_t _Var4;
  int *piVar5;
  ssize_t sVar6;
  long in_FS_OFFSET;
  uint local_14c;
  UINT CurrentPosition;
  UINT x;
  UINT BUFFER_SIZE;
  INT OrigSize;
  stat FileInfo;
  UINT local_a8;
  INT TruncateRetVal;
  PAL_ERROR palError;
  UINT NewSize_local;
  INT UnixFD_local;
  BYTE buf [128];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8 = 0;
  FileInfo.__glibc_reserved[2]._4_4_ = 0xffffffff;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  FileInfo.__glibc_reserved[2]._4_4_ = ftruncate64(UnixFD,(ulong)NewSize);
  fstat64(UnixFD,(stat64 *)&BUFFER_SIZE);
  if ((FileInfo.__glibc_reserved[2]._4_4_ != 0) || (FileInfo.st_rdev != (long)(int)NewSize)) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    uVar3 = lseek64(UnixFD,0,1);
    _Var4 = lseek64(UnixFD,0,2);
    uVar2 = (uint)_Var4;
    if (uVar2 == 0xffffffff) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      piVar5 = __errno_location();
      strerror(*piVar5);
      local_a8 = 0x54f;
    }
    else {
      if (NewSize <= uVar2) {
        NewSize_local = 1;
        goto LAB_0023d5b1;
      }
      memset(&UnixFD_local,0,0x80);
      for (local_14c = 0; local_14c < (NewSize - uVar2) - 0x80; local_14c = local_14c + 0x80) {
        sVar6 = write(UnixFD,&UnixFD_local,0x80);
        if (sVar6 == -1) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          piVar5 = __errno_location();
          strerror(*piVar5);
          piVar5 = __errno_location();
          if ((*piVar5 == 0x1c) || (piVar5 = __errno_location(), *piVar5 == 0x7a)) {
            local_a8 = 0x70;
          }
          else {
            local_a8 = 0x54f;
          }
          goto LAB_0023d5a5;
        }
      }
      if ((local_14c == NewSize) ||
         (sVar6 = write(UnixFD,&UnixFD_local,(ulong)((NewSize - uVar2) - local_14c)), sVar6 != -1))
      {
        lseek64(UnixFD,uVar3 & 0xffffffff,0);
      }
      else {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        piVar5 = __errno_location();
        strerror(*piVar5);
        piVar5 = __errno_location();
        if ((*piVar5 == 0x1c) || (piVar5 = __errno_location(), *piVar5 == 0x7a)) {
          local_a8 = 0x70;
        }
        else {
          local_a8 = 0x54f;
        }
      }
    }
  }
LAB_0023d5a5:
  NewSize_local = local_a8;
LAB_0023d5b1:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return NewSize_local;
}

Assistant:

static PAL_ERROR MAPGrowLocalFile( INT UnixFD, UINT NewSize )
{
    PAL_ERROR palError = NO_ERROR;
    INT  TruncateRetVal = -1;
    struct stat FileInfo;
    TRACE( "Entered MapGrowLocalFile (UnixFD=%d,NewSize%d)\n", UnixFD, NewSize );

    //
    // TODO: can we add configure flags to model the behavior of ftruncate
    // among our various target platforms? How much would that actually gain
    // us?
    //

    /* ftruncate is a standard function, but the behavior of enlarging files is
    non-standard.  So I will try to enlarge a file, and if that fails try the
    less efficent way.*/
    TruncateRetVal = ftruncate( UnixFD, NewSize );
    fstat( UnixFD, &FileInfo );

    if ( TruncateRetVal != 0 || FileInfo.st_size != (int) NewSize )
    {
        INT OrigSize;
        CONST UINT  BUFFER_SIZE = 128;
        BYTE buf[BUFFER_SIZE];
        UINT x = 0;
        UINT CurrentPosition = 0;

        TRACE( "Trying the less efficent way.\n" );

        CurrentPosition = lseek( UnixFD, 0, SEEK_CUR );
        OrigSize = lseek( UnixFD, 0, SEEK_END );
        if ( OrigSize == -1 )
        {
            ERROR( "Unable to locate the EOF marker. Reason=%s\n",
                   strerror( errno ) );
            palError = ERROR_INTERNAL_ERROR;
            goto done;
        }

        if (NewSize <= (UINT) OrigSize)
        {
            return TRUE;
        }

        memset( buf, 0, BUFFER_SIZE );

        for ( x = 0; x < NewSize - OrigSize - BUFFER_SIZE; x += BUFFER_SIZE )
        {
            if ( write( UnixFD, (LPVOID)buf, BUFFER_SIZE ) == -1 )
            {
                ERROR( "Unable to grow the file. Reason=%s\n", strerror( errno ) );
                if((errno == ENOSPC) || (errno == EDQUOT))
                {
                    palError = ERROR_DISK_FULL;
                }
                else
                {
                    palError = ERROR_INTERNAL_ERROR;
                }
                goto done;
            }
        }
        /* Catch any left overs. */
        if ( x != NewSize )
        {
            if ( write( UnixFD, (LPVOID)buf, NewSize - OrigSize - x) == -1 )
            {
                ERROR( "Unable to grow the file. Reason=%s\n", strerror( errno ) );
                if((errno == ENOSPC) || (errno == EDQUOT))
                {
                    palError = ERROR_DISK_FULL;
                }
                else
                {
                    palError = ERROR_INTERNAL_ERROR;
                }
                goto done;
            }
        }

        /* restore the file pointer position */
        lseek( UnixFD, CurrentPosition, SEEK_SET );
    }

done:
    return palError;
}